

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Invert(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  undefined1 auVar1 [16];
  PLSample PVar2;
  size_t sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long in_RSI;
  Tuple2<pbrt::Vector2,_int> *in_RDI;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [64];
  float r1;
  float r0;
  float v1;
  float v0;
  float pdf;
  float c1;
  float c0;
  Vector2f w0;
  Vector2f w1;
  float v11;
  float v01;
  float v10;
  float v00;
  uint32_t slice_size;
  uint32_t offset;
  Vector2i pos;
  float p1;
  float p0;
  uint32_t param_index;
  size_t dim;
  uint32_t slice_offset;
  float param_weight [4];
  Vector2<float> *in_stack_fffffffffffffea8;
  Tuple2<pbrt::Vector2,_float> *this_00;
  Tuple2<pbrt::Vector2,_int> *t1;
  Tuple2<pbrt::Vector2,_float> *t0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_01;
  undefined8 in_stack_fffffffffffffed0;
  undefined1 *puVar12;
  anon_class_24_3_14863758 *in_stack_fffffffffffffed8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_02;
  undefined4 in_stack_fffffffffffffee0;
  float fVar13;
  undefined4 in_stack_fffffffffffffee4;
  float fVar14;
  undefined1 local_c8 [8];
  ulong local_c0;
  float local_b8;
  float fStack_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  int local_a0;
  int local_9c;
  Vector2<float> local_98;
  Tuple2<pbrt::Vector2,_float> local_90;
  Tuple2<pbrt::Vector2,_int> local_88;
  Tuple2<pbrt::Vector2,_int> local_80;
  Tuple2<pbrt::Vector2,_int> local_78;
  float local_70;
  value_type_conflict1 local_6c;
  ulong *local_60;
  long *local_58;
  uint local_4c;
  ulong local_48;
  int local_3c;
  float local_38 [4];
  long local_28 [2];
  Tuple2<pbrt::Vector2,_float> local_18;
  Tuple2<pbrt::Vector2,_float> local_10;
  undefined1 extraout_var [56];
  
  local_18 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_3c = 0;
  local_28[0] = in_RSI;
  for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
    if ((&in_RDI[3].x)[local_48] == 1) {
      local_38[local_48 * 2] = 1.0;
      *(undefined4 *)((long)local_28 + local_48 * 8 + -0xc) = 0;
    }
    else {
      local_60 = &local_48;
      local_58 = local_28;
      sVar3 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Invert(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_1_>
                        (CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
      local_4c = (uint)sVar3;
      pvVar4 = pstd::
               vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
               ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                             *)(in_RDI + 5),local_48);
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (pvVar4,(ulong)local_4c);
      local_6c = *pvVar5;
      pvVar4 = pstd::
               vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
               ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                             *)(in_RDI + 5),local_48);
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (pvVar4,(ulong)(local_4c + 1));
      local_70 = *pvVar5;
      fVar6 = Clamp<float,float,float>
                        ((*(float *)(local_28[0] + local_48 * 4) - local_6c) / (local_70 - local_6c)
                         ,0.0,1.0);
      *(float *)((long)local_28 + local_48 * 8 + -0xc) = fVar6;
      local_38[local_48 * 2] = 1.0 - *(float *)((long)local_28 + local_48 * 8 + -0xc);
      local_3c = (&in_RDI[4].x)[local_48] * local_4c + local_3c;
    }
  }
  local_18.y = local_18.y * (float)in_RDI[2].y;
  t1 = &local_80;
  t0 = &local_18;
  local_18.x = local_18.x * (float)in_RDI[2].x;
  Vector2<int>::Vector2<float>((Vector2<int> *)t1,in_stack_fffffffffffffea8);
  this_00 = &local_90;
  Vector2<int>::Vector2((Vector2<int> *)t1,(int)((ulong)this_00 >> 0x20),(int)this_00);
  local_88 = (Tuple2<pbrt::Vector2,_int>)
             Tuple2<pbrt::Vector2,int>::operator-
                       ((Tuple2<pbrt::Vector2,_int> *)this_00,(Vector2<int> *)0x69ee91);
  local_78 = (Tuple2<pbrt::Vector2,_int>)Min<pbrt::Vector2,int>((Tuple2<pbrt::Vector2,_int> *)t0,t1)
  ;
  Vector2<float>::Vector2<int>((Vector2<float> *)t1,(Vector2<int> *)this_00);
  Tuple2<pbrt::Vector2,float>::operator-=((Tuple2<pbrt::Vector2,float> *)t0,&local_98);
  local_9c = local_78.x + local_78.y * in_RDI->x;
  local_a0 = HProd<pbrt::Vector2,int>(in_RDI);
  local_9c = local_9c + local_3c * local_a0;
  this_01 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 9);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_01);
  local_a4 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (float *)in_stack_fffffffffffffed8,
                            (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffed0,(float *)this_01);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_01);
  local_a8 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (float *)in_stack_fffffffffffffed8,
                            (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffed0,(float *)this_01);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_01);
  local_ac = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (float *)in_stack_fffffffffffffed8,
                            (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffed0,(float *)this_01);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_01);
  local_b0 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (float *)in_stack_fffffffffffffed8,
                            (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (uint32_t)in_stack_fffffffffffffed0,(float *)this_01);
  local_b8 = local_18.x;
  fStack_b4 = local_18.y;
  puVar12 = local_c8;
  fVar13 = 1.0;
  Vector2<float>::Vector2((Vector2<float> *)t1,(float)((ulong)this_00 >> 0x20),SUB84(this_00,0));
  auVar11._0_8_ = Tuple2<pbrt::Vector2,float>::operator-(this_00,(Vector2<float> *)0x69f05a);
  auVar11._8_56_ = extraout_var;
  local_c0 = vmovlpd_avx(auVar11._0_16_);
  dVar8 = std::fma((double)(local_c0 >> 0x20),(double)(ulong)(uint)local_a4,
                   (double)(ulong)(uint)(fStack_b4 * local_ac));
  dVar9 = std::fma((double)(local_c0 >> 0x20),(double)(ulong)(uint)local_a8,
                   (double)(ulong)(uint)(fStack_b4 * local_b0));
  dVar10 = std::fma((double)(local_c0 & 0xffffffff),(double)((ulong)dVar8 & 0xffffffff),
                    (double)(ulong)(uint)(local_b8 * SUB84(dVar9,0)));
  fVar14 = 0.5;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(SUB84(dVar9,0) - SUB84(dVar8,0))),
                           ZEXT416((uint)(local_18.x * 0.5)),ZEXT416((uint)SUB84(dVar8,0)));
  local_18.x = local_18.x * auVar1._0_4_;
  this_02 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x11);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_02);
  fVar6 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)CONCAT44(fVar14,fVar13),(float *)this_02,
                         (uint32_t)((ulong)puVar12 >> 0x20),(uint32_t)puVar12,(float *)this_01);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_02);
  fVar7 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)CONCAT44(fVar14,fVar13),(float *)this_02,
                         (uint32_t)((ulong)puVar12 >> 0x20),(uint32_t)puVar12,(float *)this_01);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)(fVar13 - local_18.y)),
                           ZEXT416((uint)(local_18.y * fVar7)));
  local_18.x = local_18.x + auVar1._0_4_;
  local_9c = local_78.y * in_RDI->x + local_3c * local_a0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_02);
  fVar6 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)CONCAT44(fVar14,fVar13),(float *)this_02,
                         (uint32_t)((ulong)puVar12 >> 0x20),(uint32_t)puVar12,(float *)this_01);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data(this_02);
  fVar7 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)CONCAT44(fVar14,fVar13),(float *)this_02,
                         (uint32_t)((ulong)puVar12 >> 0x20),(uint32_t)puVar12,(float *)this_01);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)(fVar13 - local_18.y)),
                           ZEXT416((uint)(local_18.y * fVar7)));
  local_18.x = local_18.x / auVar1._0_4_;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)(fVar7 - fVar6)),ZEXT416((uint)(local_18.y * fVar14)),
                           ZEXT416((uint)fVar6));
  local_18.y = local_18.y * auVar1._0_4_;
  local_9c = local_78.y + local_3c * in_RDI->y;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0xd));
  fVar6 = lookup<2UL,_0>((PiecewiseLinear2D<2UL> *)CONCAT44(fVar14,fVar13),(float *)this_02,
                         (uint32_t)((ulong)puVar12 >> 0x20),(uint32_t)puVar12,(float *)this_01);
  local_18.y = local_18.y + fVar6;
  local_10 = local_18;
  fVar6 = HProd<pbrt::Vector2,float>((Tuple2<pbrt::Vector2,_float> *)(in_RDI + 2));
  PVar2.pdf = SUB84(dVar10,0) * fVar6;
  PVar2.p.super_Tuple2<pbrt::Vector2,_float> = local_10;
  return PVar2;
}

Assistant:

PBRT_CPU_GPU
    PLSample Invert(Vector2f sample, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Fetch values at corners of bilinear patch */
        sample.x *= m_inv_patch_size.x;
        sample.y *= m_inv_patch_size.y;
        Vector2i pos = Min(Vector2i(sample), m_size - Vector2i(2, 2));
        sample -= Vector2f(pos);

        uint32_t offset = pos.x + pos.y * m_size.x;
        uint32_t slice_size = HProd(m_size);
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        /* Invert the X component */
        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight);

        Vector2f w1 = sample, w0 = Vector2f(1, 1) - w1;

        float c0 = std::fma(w0.y, v00, w1.y * v01), c1 = std::fma(w0.y, v10, w1.y * v11),
              pdf = std::fma(w0.x, c0, w1.x * c1);

        sample.x *= c0 + .5f * sample.x * (c1 - c0);

        float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset, slice_size,
                                     param_weight),
              v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x, offset,
                                     slice_size, param_weight);

        sample.x += (1.f - sample.y) * v0 + sample.y * v1;

        offset = pos.y * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        sample.x /= (1.f - sample.y) * r0 + sample.y * r1;

        /* Invert the Y component */
        sample.y *= r0 + .5f * sample.y * (r1 - r0);

        offset = pos.y;
        if (Dimension != 0)
            offset += slice_offset * m_size.y;

        sample.y +=
            lookup<Dimension>(m_marginal_cdf.data(), offset, m_size.y, param_weight);

        return {sample, pdf * HProd(m_inv_patch_size)};
    }